

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O3

void __thiscall QDirListingPrivate::pushDirectory(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  _Head_base<0UL,_QAbstractFileEngine_*,_false> _Var1;
  QFileInfo *this_00;
  int *piVar2;
  QFileSystemIterator *this_01;
  optional<QFileInfo> *this_02;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<QString,_true,_true>,_bool> pVar3;
  QString local_60;
  QString local_48;
  _Hashtable_alloc<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
  *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDirEntryInfo::filePath(&local_48,entryInfo);
  if (((this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
       super_QFlagsStorage<QDirListing::IteratorFlag>.i & 0x800) != 0) {
    this_00 = QDirEntryInfo::fileInfo(entryInfo);
    QFileInfo::canonicalFilePath(&local_60,this_00);
    local_30 = &(this->visitedLinks).set._M_h.
                super__Hashtable_alloc<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
    ;
    pVar3 = std::
            _Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<QString,std::__detail::_AllocNode<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,true>>>>
                      ((_Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&(this->visitedLinks).set,&local_60);
    if ((QFileSystemIterator *)local_60.d.d != (QFileSystemIterator *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_60.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_60.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_60.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
    goto LAB_0022f722;
  }
  _Var1._M_head_impl =
       (this->engine)._M_t.
       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
       super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (QAbstractFileEngine *)0x0) {
    if ((entryInfo->fileInfoOpt).super__Optional_base<QFileInfo,_false,_false>._M_payload.
        super__Optional_payload<QFileInfo,_true,_false,_false>.
        super__Optional_payload_base<QFileInfo>._M_engaged == true) {
      this_02 = &entryInfo->fileInfoOpt;
      piVar2 = (int *)(this_02->super__Optional_base<QFileInfo,_false,_false>)._M_payload.
                      super__Optional_payload<QFileInfo,_true,_false,_false>.
                      super__Optional_payload_base<QFileInfo>._M_payload.field2;
      if (piVar2 == (int *)0x0) {
        piVar2 = (int *)0x0;
      }
      else if (*piVar2 != 1) {
        QSharedDataPointer<QFileInfoPrivate>::detach_helper
                  ((QSharedDataPointer<QFileInfoPrivate> *)this_02);
        piVar2 = (int *)(this_02->super__Optional_base<QFileInfo,_false,_false>)._M_payload.
                        super__Optional_payload<QFileInfo,_true,_false,_false>.
                        super__Optional_payload_base<QFileInfo>._M_payload.field2;
      }
      entryInfo = (QDirEntryInfo *)(piVar2 + 2);
    }
    this_01 = (QFileSystemIterator *)operator_new(0x68);
    QFileSystemIterator::QFileSystemIterator
              (this_01,&entryInfo->entry,
               (IteratorFlags)
               (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
               super_QFlagsStorage<QDirListing::IteratorFlag>.i);
    local_60.d.d = (Data *)this_01;
    std::
    vector<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>,std::allocator<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>>>
    ::emplace_back<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>>
              ((vector<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>,std::allocator<std::unique_ptr<QFileSystemIterator,std::default_delete<QFileSystemIterator>>>>
                *)&this->nativeIterators,
               (unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)
               &local_60);
    std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>::~unique_ptr
              ((unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)
               &local_60);
  }
  else {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_QAbstractFileEngine + 0xf0))
              (_Var1._M_head_impl,&local_48);
    local_60.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    _Var1._M_head_impl =
         (this->engine)._M_t.
         super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
         super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
         super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_QAbstractFileEngine + 0x110))
              (&local_60,_Var1._M_head_impl,&local_48,
               (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
               super_QFlagsStorage<QDirListing::IteratorFlag>.i,&this->nameFilters);
    if ((QFileSystemIterator *)local_60.d.d != (QFileSystemIterator *)0x0) {
      std::
      vector<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>,std::allocator<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>>>
      ::
      emplace_back<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>>
                ((vector<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>,std::allocator<std::unique_ptr<QAbstractFileEngineIterator,std::default_delete<QAbstractFileEngineIterator>>>>
                  *)&this->fileEngineIterators,
                 (unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
                  *)&local_60);
      if ((QFileSystemIterator *)local_60.d.d != (QFileSystemIterator *)0x0) {
        (*(code *)(((((QString *)&(local_60.d.d)->super_QArrayData)->d).d)->super_QArrayData).alloc)
                  ();
      }
    }
  }
LAB_0022f722:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDirListingPrivate::pushDirectory(QDirEntryInfo &entryInfo)
{
    const QString path = [&entryInfo] {
#ifdef Q_OS_WIN
        if (entryInfo.isSymLink())
            return entryInfo.canonicalFilePath();
#endif
        return entryInfo.filePath();
    }();


    if (iteratorFlags.testAnyFlags(QDirListing::IteratorFlag::FollowDirSymlinks)) {
        // Stop link loops
        if (visitedLinks.hasSeen(entryInfo.canonicalFilePath()))
            return;
    }

    if (engine) {
        engine->setFileName(path);
        if (auto it = engine->beginEntryList(path, iteratorFlags, nameFilters)) {
            fileEngineIterators.emplace_back(std::move(it));
        } else {
            // No iterator; no entry list.
        }
    } else {
#ifndef QT_NO_FILESYSTEMITERATOR
        QFileSystemEntry *fentry = nullptr;
        if (entryInfo.fileInfoOpt)
            fentry = &entryInfo.fileInfoOpt->d_ptr->fileEntry;
        else
            fentry = &entryInfo.entry;
        nativeIterators.emplace_back(std::make_unique<QFileSystemIterator>(*fentry, iteratorFlags));
#else
        qWarning("Qt was built with -no-feature-filesystemiterator: no files/plugins will be found!");
#endif
    }
}